

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

Totals * Catch::runTests(Ptr<Catch::Config> *config)

{
  bool bVar1;
  Config *pCVar2;
  RunContext *this;
  const_iterator testSpec_00;
  const_iterator totals;
  reference pTVar3;
  IConfig *pIVar4;
  Ptr<Catch::Config> *in_RSI;
  Totals *in_RDI;
  const_iterator itEnd;
  const_iterator it;
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *allTestCases;
  TestSpec testSpec;
  RunContext context;
  Ptr<Catch::IStreamingReporter> reporter;
  Ptr<const_Catch::IConfig> iconfig;
  Totals *in_stack_fffffffffffffbd8;
  RunContext *in_stack_fffffffffffffbe0;
  undefined7 in_stack_fffffffffffffbe8;
  undefined1 in_stack_fffffffffffffbef;
  Ptr<Catch::IStreamingReporter> *in_stack_fffffffffffffbf8;
  undefined7 in_stack_fffffffffffffc00;
  undefined1 in_stack_fffffffffffffc07;
  string *in_stack_fffffffffffffc08;
  TestSpecParser *in_stack_fffffffffffffc10;
  size_t in_stack_fffffffffffffc28;
  undefined7 in_stack_fffffffffffffc30;
  undefined1 in_stack_fffffffffffffc37;
  string *in_stack_fffffffffffffc38;
  RunContext *in_stack_fffffffffffffc40;
  RunContext *in_stack_fffffffffffffc60;
  Ptr<Catch::Config> *in_stack_fffffffffffffc68;
  Ptr<Catch::IStreamingReporter> *in_stack_fffffffffffffc70;
  Ptr<const_Catch::IConfig> *in_stack_fffffffffffffc78;
  RunContext *in_stack_fffffffffffffc80;
  size_t in_stack_fffffffffffffca0;
  size_t in_stack_fffffffffffffca8;
  allocator local_331;
  string local_330 [192];
  string local_270 [440];
  TestCase *in_stack_ffffffffffffff48;
  RunContext *in_stack_ffffffffffffff50;
  Ptr<Catch::IStreamingReporter> local_18;
  Ptr<const_Catch::IConfig> local_10;
  Ptr<Catch::Config> *local_8;
  
  local_8 = in_RSI;
  Ptr<Catch::Config>::get(in_RSI);
  Ptr<const_Catch::IConfig>::Ptr
            ((Ptr<const_Catch::IConfig> *)in_stack_fffffffffffffbe0,
             (IConfig *)in_stack_fffffffffffffbd8);
  makeReporter(in_stack_fffffffffffffc68);
  Ptr<Catch::IStreamingReporter>::Ptr
            ((Ptr<Catch::IStreamingReporter> *)in_stack_fffffffffffffbe0,
             (Ptr<Catch::IStreamingReporter> *)in_stack_fffffffffffffbd8);
  addListeners((Ptr<const_Catch::IConfig> *)in_stack_fffffffffffffc68,
               (Ptr<Catch::IStreamingReporter> *)in_stack_fffffffffffffc60);
  Ptr<Catch::IStreamingReporter>::operator=
            ((Ptr<Catch::IStreamingReporter> *)
             CONCAT17(in_stack_fffffffffffffc07,in_stack_fffffffffffffc00),in_stack_fffffffffffffbf8
            );
  Ptr<Catch::IStreamingReporter>::~Ptr((Ptr<Catch::IStreamingReporter> *)in_stack_fffffffffffffbe0);
  Ptr<Catch::IStreamingReporter>::~Ptr((Ptr<Catch::IStreamingReporter> *)in_stack_fffffffffffffbe0);
  RunContext::RunContext
            (in_stack_fffffffffffffc80,in_stack_fffffffffffffc78,in_stack_fffffffffffffc70);
  Totals::Totals((Totals *)in_stack_fffffffffffffbe0);
  pCVar2 = Ptr<Catch::Config>::operator->(local_8);
  (*(pCVar2->super_SharedImpl<Catch::IConfig>).super_IConfig.super_IShared.super_NonCopyable.
    _vptr_NonCopyable[6])(local_270);
  RunContext::testGroupStarting
            (in_stack_fffffffffffffc40,in_stack_fffffffffffffc38,
             CONCAT17(in_stack_fffffffffffffc37,in_stack_fffffffffffffc30),in_stack_fffffffffffffc28
            );
  std::__cxx11::string::~string(local_270);
  pCVar2 = Ptr<Catch::Config>::operator->(local_8);
  (*(pCVar2->super_SharedImpl<Catch::IConfig>).super_IConfig.super_IShared.super_NonCopyable.
    _vptr_NonCopyable[0xd])();
  TestSpec::TestSpec((TestSpec *)in_stack_fffffffffffffbe0,(TestSpec *)in_stack_fffffffffffffbd8);
  bVar1 = TestSpec::hasFilters((TestSpec *)0x1799f4);
  if (!bVar1) {
    ITagAliasRegistry::get();
    TestSpecParser::TestSpecParser
              ((TestSpecParser *)in_stack_fffffffffffffbe0,
               (ITagAliasRegistry *)in_stack_fffffffffffffbd8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_330,"~[.]",&local_331);
    TestSpecParser::parse(in_stack_fffffffffffffc10,in_stack_fffffffffffffc08);
    TestSpecParser::testSpec
              ((TestSpecParser *)CONCAT17(in_stack_fffffffffffffbef,in_stack_fffffffffffffbe8));
    TestSpec::operator=((TestSpec *)in_stack_fffffffffffffbe0,(TestSpec *)in_stack_fffffffffffffbd8)
    ;
    TestSpec::~TestSpec((TestSpec *)0x179aa7);
    std::__cxx11::string::~string(local_330);
    std::allocator<char>::~allocator((allocator<char> *)&local_331);
    TestSpecParser::~TestSpecParser((TestSpecParser *)in_stack_fffffffffffffbe0);
  }
  Ptr<const_Catch::IConfig>::operator*(&local_10);
  this = (RunContext *)getAllTestCasesSorted((IConfig *)0x179c1a);
  testSpec_00 = std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::begin
                          ((vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *)
                           in_stack_fffffffffffffbd8);
  totals = std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::end
                     ((vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *)
                      in_stack_fffffffffffffbd8);
  do {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
                        *)in_stack_fffffffffffffbe0,
                       (__normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
                        *)in_stack_fffffffffffffbd8);
    if (!bVar1) {
      pIVar4 = Ptr<const_Catch::IConfig>::operator->(&local_10);
      (*(pIVar4->super_IShared).super_NonCopyable._vptr_NonCopyable[6])(&stack0xfffffffffffffc60);
      RunContext::testGroupEnded
                (this,(string *)testSpec_00._M_current,(Totals *)totals._M_current,
                 in_stack_fffffffffffffca8,in_stack_fffffffffffffca0);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffc60);
      TestSpec::~TestSpec((TestSpec *)0x179dd7);
      RunContext::~RunContext(in_stack_fffffffffffffc60);
      Ptr<Catch::IStreamingReporter>::~Ptr
                ((Ptr<Catch::IStreamingReporter> *)in_stack_fffffffffffffbe0);
      Ptr<const_Catch::IConfig>::~Ptr((Ptr<const_Catch::IConfig> *)in_stack_fffffffffffffbe0);
      return in_RDI;
    }
    bVar1 = RunContext::aborting(in_stack_fffffffffffffbe0);
    if (bVar1) {
LAB_00179d21:
      in_stack_fffffffffffffbe0 =
           (RunContext *)Ptr<Catch::IStreamingReporter>::operator->(&local_18);
      pTVar3 = __gnu_cxx::
               __normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
               ::operator*((__normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
                            *)&stack0xfffffffffffffcb8);
      (*((NonCopyable *)&((Counts *)&in_stack_fffffffffffffbe0->super_IResultCapture)->passed)->
        _vptr_NonCopyable[0x10])(in_stack_fffffffffffffbe0,pTVar3);
    }
    else {
      pTVar3 = __gnu_cxx::
               __normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
               ::operator*((__normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
                            *)&stack0xfffffffffffffcb8);
      Ptr<const_Catch::IConfig>::operator*(&local_10);
      in_stack_fffffffffffffbef =
           matchTest(pTVar3,(TestSpec *)
                            CONCAT17(in_stack_fffffffffffffbef,in_stack_fffffffffffffbe8),
                     (IConfig *)in_stack_fffffffffffffbe0);
      if (!(bool)in_stack_fffffffffffffbef) goto LAB_00179d21;
      __gnu_cxx::
      __normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
      ::operator*((__normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
                   *)&stack0xfffffffffffffcb8);
      RunContext::runTest(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
      Totals::operator+=((Totals *)in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8);
    }
    __gnu_cxx::
    __normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
    ::operator++((__normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
                  *)&stack0xfffffffffffffcb8);
  } while( true );
}

Assistant:

Totals runTests( Ptr<Config> const& config ) {

        Ptr<IConfig const> iconfig = config.get();

        Ptr<IStreamingReporter> reporter = makeReporter( config );
        reporter = addListeners( iconfig, reporter );

        RunContext context( iconfig, reporter );

        Totals totals;

        context.testGroupStarting( config->name(), 1, 1 );

        TestSpec testSpec = config->testSpec();
        if( !testSpec.hasFilters() )
            testSpec = TestSpecParser( ITagAliasRegistry::get() ).parse( "~[.]" ).testSpec(); // All not hidden tests

        std::vector<TestCase> const& allTestCases = getAllTestCasesSorted( *iconfig );
        for( std::vector<TestCase>::const_iterator it = allTestCases.begin(), itEnd = allTestCases.end();
                it != itEnd;
                ++it ) {
            if( !context.aborting() && matchTest( *it, testSpec, *iconfig ) )
                totals += context.runTest( *it );
            else
                reporter->skipTest( *it );
        }

        context.testGroupEnded( iconfig->name(), totals, 1, 1 );
        return totals;
    }